

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall efsw::String::append(String *this,char *s,size_t n)

{
  String tmp;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  String((String *)&local_30,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  append(&this->mString,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return this;
}

Assistant:

String& String::append( const char* s, size_t n ) {
	String tmp( s );

	mString.append( tmp.mString );

	return *this;
}